

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O2

void spdlog::throw_spdlog_ex(string *msg)

{
  spdlog_ex *this;
  string sStack_38;
  
  this = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&sStack_38,(string *)msg);
  spdlog_ex::spdlog_ex(this,&sStack_38);
  __cxa_throw(this,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void throw_spdlog_ex(std::string msg) { SPDLOG_THROW(spdlog_ex(std::move(msg))); }